

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

DynamicTypeHandler * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::Clone
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          Recycler *recycler)

{
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_00;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  local_18 = recycler;
  recycler_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)
             &SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
             ,0x15d);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  this_00 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *)
            new<Memory::Recycler>(0x30,alloc,0x43c4b0);
  SimpleDictionaryTypeHandlerBase(this_00,local_18,this);
  return &this_00->super_DynamicTypeHandler;
}

Assistant:

DynamicTypeHandler * SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, SimpleDictionaryTypeHandlerBase, recycler, this);
    }